

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerDatasetFromJson
                  (Error *__return_storage_ptr__,CommissionerDataset *aDataset,string *aJson)

{
  char *begin;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Json json;
  undefined1 local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8 [4];
  string local_c8;
  undefined1 local_a8 [32];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  parse_func ap_Stack_80 [1];
  pointer local_78;
  pointer puStack_70;
  pointer local_68;
  pointer puStack_60;
  undefined8 local_58;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_68 = (pointer)0x0;
  puStack_60 = (pointer)0x0;
  local_78 = (pointer)0x0;
  puStack_70 = (pointer)0x0;
  local_88 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  ap_Stack_80[0] = (parse_func)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_58._0_2_ = 0;
  local_58._2_2_ = 0;
  local_58._4_2_ = 0;
  local_58._6_2_ = 0;
  CommissionerDataset::operator=(aDataset,(CommissionerDataset *)local_a8);
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_a8);
  StripComments((string *)local_a8,aJson);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&json,(input_adapter *)local_f0,(parser_callback_t *)&local_48,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e8);
  std::__cxx11::string::~string((string *)local_a8);
  if (json.m_type == null) {
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
    local_a8._8_8_ = "Empty commissioner dataset JSON";
    local_a8._16_8_ = (pointer)0x1f;
    local_a8._24_8_ = (pointer)0x0;
    ap_Stack_80[0] = (parse_func)0x0;
    pcVar1 = "Empty commissioner dataset JSON";
    local_88 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a8;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_a8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c8,(v10 *)"Empty commissioner dataset JSON",(string_view)ZEXT816(0x1f),args);
    local_f0._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)local_e8,(string *)&local_c8);
    Error::operator=(__return_storage_ptr__,(Error *)local_f0);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::CommissionerDataset,_ot::commissioner::CommissionerDataset,_0>
              ((CommissionerDataset *)local_a8,&json);
    CommissionerDataset::operator=(aDataset,(CommissionerDataset *)local_a8);
    CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_a8);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerDatasetFromJson(CommissionerDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = CommissionerDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty commissioner dataset JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}